

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_sense(envy_bios *bios)

{
  uint8_t *res;
  uint8_t *res_00;
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  envy_bios_power_sense_entry *peVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int local_54;
  
  uVar10 = (bios->power).sense.offset;
  iVar5 = -0x16;
  if (uVar10 != 0) {
    bios_u8(bios,uVar10,&(bios->power).sense.version);
    uVar1 = (bios->power).sense.version;
    if ((uVar1 == ' ') || (uVar1 == '\x10')) {
      iVar5 = bios_u8(bios,(bios->power).sense.offset + 1,&(bios->power).sense.hlen);
      res = &(bios->power).sense.rlen;
      iVar6 = bios_u8(bios,(bios->power).sense.offset + 2,res);
      res_00 = &(bios->power).sense.entriesnum;
      iVar7 = bios_u8(bios,(bios->power).sense.offset + 3,res_00);
      (bios->power).sense.valid = iVar7 == 0 && (iVar6 == 0 && iVar5 == 0);
      uVar11 = (ulong)(bios->power).sense.entriesnum;
      peVar8 = (envy_bios_power_sense_entry *)malloc(uVar11 * 0x18);
      (bios->power).sense.entries = peVar8;
      lVar12 = 6;
      local_54 = 0;
      for (uVar9 = 0; uVar9 < uVar11; uVar9 = uVar9 + 1) {
        uVar4 = (bios->power).sense.offset;
        bVar2 = (bios->power).sense.hlen;
        bVar3 = (bios->power).sense.rlen;
        uVar10 = (int)uVar9 * (uint)bVar3 + uVar4 + (uint)bVar2;
        peVar8 = (bios->power).sense.entries;
        peVar8[uVar9].offset = uVar10;
        uVar1 = (bios->power).sense.version;
        if (uVar1 == ' ') {
          bios_u8(bios,uVar10,&peVar8[uVar9].mode);
          bios_u8(bios,uVar10 + 1,&(bios->power).sense.entries[uVar9].extdev_id);
          if (0x15 < (bios->power).sense.rlen) {
            fwrite("SENSE table entry bigger than expected\n",0x27,1,_stderr);
          }
          for (uVar11 = 0; (uVar11 < 0x10 && ((long)uVar11 < (long)((ulong)*res - 5)));
              uVar11 = uVar11 + 1) {
            bios_u8(bios,(uint)bVar2 + uVar4 + (uint)bVar3 * local_54 + 5 + (int)uVar11,
                    (uint8_t *)((long)&((bios->power).sense.entries)->offset + uVar11 + lVar12));
          }
        }
        else if (uVar1 == '\x10') {
          bios_u8(bios,uVar10 + 1,&peVar8[uVar9].mode);
          bios_u8(bios,uVar10 + 2,&(bios->power).sense.entries[uVar9].extdev_id);
          if (0x13 < (bios->power).sense.rlen) {
            fwrite("SENSE table entry bigger than expected\n",0x27,1,_stderr);
          }
          for (uVar11 = 0; (uVar11 < 0x10 && ((long)uVar11 < (long)((ulong)*res - 3)));
              uVar11 = uVar11 + 1) {
            bios_u8(bios,(uint)bVar2 + uVar4 + (uint)bVar3 * local_54 + 3 + (int)uVar11,
                    (uint8_t *)((long)&((bios->power).sense.entries)->offset + uVar11 + lVar12));
          }
        }
        uVar11 = (ulong)*res_00;
        lVar12 = lVar12 + 0x18;
        local_54 = local_54 + 1;
      }
      iVar5 = 0;
    }
    else {
      fprintf(_stderr,"Unknown SENSE table version 0x%x\n");
    }
  }
  return iVar5;
}

Assistant:

int envy_bios_parse_power_sense(struct envy_bios *bios) {
	struct envy_bios_power_sense *sense = &bios->power.sense;
	int i, err = 0;

	if (!sense->offset)
		return -EINVAL;

	bios_u8(bios, sense->offset + 0x0, &sense->version);
	switch(sense->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, sense->offset + 0x1, &sense->hlen);
		err |= bios_u8(bios, sense->offset + 0x2, &sense->rlen);
		err |= bios_u8(bios, sense->offset + 0x3, &sense->entriesnum);
		sense->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown SENSE table version 0x%x\n", sense->version);
		return -EINVAL;
	};

	err = 0;
	sense->entries = malloc(sense->entriesnum * sizeof(struct envy_bios_power_sense_entry));
	for (i = 0; i < sense->entriesnum; i++) {
		uint32_t data = sense->offset + sense->hlen + i * sense->rlen;

		sense->entries[i].offset = data;

		switch(sense->version) {
		case 0x10:
			err |= bios_u8(bios, data + 0x1, &sense->entries[i].mode);
			err |= bios_u8(bios, data + 0x2, &sense->entries[i].extdev_id);
			if (sense->rlen - 0x3 > 0x10)
				ENVY_BIOS_ERR("SENSE table entry bigger than expected\n");
			for (int j = 0; j < sense->rlen - 0x3 && j < 0x10; ++j)
				err |= bios_u8(bios, data + 0x3 + j, &sense->entries[i].d.raw[j]);
			break;
		case 0x20:
			err |= bios_u8(bios, data + 0x0, &sense->entries[i].mode);
			err |= bios_u8(bios, data + 0x1, &sense->entries[i].extdev_id);
			if (sense->rlen - 0x5 > 0x10)
				ENVY_BIOS_ERR("SENSE table entry bigger than expected\n");
			for (int j = 0; j < sense->rlen - 0x5 && j < 0x10; ++j)
				err |= bios_u8(bios, data + 0x5 + j, &sense->entries[i].d.raw[j]);
			break;
		};
	}

	return 0;
}